

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SSVectorBase(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *vec)

{
  int iVar1;
  long in_RSI;
  IdxSet *in_RDI;
  int in_stack_0000000c;
  int **in_stack_00000010;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  IdxSet *rhs;
  IdxSet *in_stack_ffffffffffffffe0;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  IdxSet::IdxSet(in_RDI);
  in_RDI->_vptr_IdxSet = (_func_int **)&PTR__SSVectorBase_004ef260;
  in_RDI[1].freeArray = (bool)(*(byte *)(in_RSI + 0x38) & 1);
  rhs = in_RDI + 2;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x3a6ba2);
  iVar1 = dim((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3a6bac);
  if (iVar1 < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = dim((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3a6bc6);
  }
  in_RDI->len = iVar1;
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  IdxSet::operator=(in_stack_ffffffffffffffe0,rhs);
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)in_RDI,
             (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

SSVectorBase(const SSVectorBase<R>& vec)
      : VectorBase<R>(vec)
      , IdxSet()
      , setupStatus(vec.setupStatus)
   {
      len = (vec.dim() < 1) ? 1 : vec.dim();
      spx_alloc(idx, len);
      IdxSet::operator=(vec);
      _tolerances = vec._tolerances;

      assert(isConsistent());
   }